

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

void lj_gc_fullgc(lua_State *L)

{
  char cVar1;
  uint uVar2;
  undefined4 uVar3;
  ulong uVar4;
  
  uVar2 = (L->glref).ptr32;
  uVar4 = (ulong)uVar2;
  uVar3 = *(undefined4 *)(uVar4 + 0x160);
  *(undefined4 *)(uVar4 + 0x160) = 0xfffffffb;
  if (*(byte *)(uVar4 + 0x59) < 3) {
    *(uint *)(uVar4 + 100) = uVar2 + 0x60;
    *(undefined8 *)(uVar4 + 0x68) = 0;
    *(undefined4 *)(uVar4 + 0x70) = 0;
    *(undefined1 *)(uVar4 + 0x59) = 3;
    *(undefined4 *)(uVar4 + 0x5c) = 0;
  }
  cVar1 = *(char *)(uVar4 + 0x59);
  while ((byte)(cVar1 - 3U) < 2) {
    gc_onestep(L);
    cVar1 = *(char *)(uVar4 + 0x59);
  }
  *(undefined1 *)(uVar4 + 0x59) = 0;
  do {
    gc_onestep(L);
  } while (*(char *)(uVar4 + 0x59) != '\0');
  *(uint *)(uVar4 + 0x54) = (*(uint *)(uVar4 + 0x7c) / 100) * *(int *)(uVar4 + 0x84);
  *(undefined4 *)(uVar4 + 0x160) = uVar3;
  return;
}

Assistant:

void lj_gc_fullgc(lua_State *L)
{
  global_State *g = G(L);
  int32_t ostate = g->vmstate;
  setvmstate(g, GC);
  if (g->gc.state <= GCSatomic) {  /* Caught somewhere in the middle. */
    setmref(g->gc.sweep, &g->gc.root);  /* Sweep everything (preserving it). */
    setgcrefnull(g->gc.gray);  /* Reset lists from partial propagation. */
    setgcrefnull(g->gc.grayagain);
    setgcrefnull(g->gc.weak);
    g->gc.state = GCSsweepstring;  /* Fast forward to the sweep phase. */
    g->gc.sweepstr = 0;
  }
  while (g->gc.state == GCSsweepstring || g->gc.state == GCSsweep)
    gc_onestep(L);  /* Finish sweep. */
  lj_assertG(g->gc.state == GCSfinalize || g->gc.state == GCSpause,
	     "bad GC state");
  /* Now perform a full GC. */
  g->gc.state = GCSpause;
  do { gc_onestep(L); } while (g->gc.state != GCSpause);
  g->gc.threshold = (g->gc.estimate/100) * g->gc.pause;
  g->vmstate = ostate;
}